

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O0

void amrex::parser_ast_get_symbols
               (parser_node *node,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *symbols,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *local_symbols)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  parser_node *in_RSI;
  int *in_RDI;
  string *msg;
  char *in_stack_ffffffffffffff78;
  char **in_stack_ffffffffffffff88;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff90;
  string local_58 [20];
  int in_stack_ffffffffffffffbc;
  undefined1 in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe1;
  
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)(*in_RDI - 1);
  switch(__rhs) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    emplace<char*&>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xb:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xd:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xf:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x11:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x13:
    parser_ast_get_symbols
              (in_RSI,in_RDX,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0));
    parser_ast_get_symbols
              (in_RSI,in_RDX,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0));
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14:
    parser_ast_get_symbols
              (in_RSI,in_RDX,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0));
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7:
    parser_ast_get_symbols
              (in_RSI,in_RDX,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0));
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8:
    parser_ast_get_symbols
              (in_RSI,in_RDX,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0));
    parser_ast_get_symbols
              (in_RSI,in_RDX,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0));
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x9:
    parser_ast_get_symbols
              (in_RSI,in_RDX,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0));
    parser_ast_get_symbols
              (in_RSI,in_RDX,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0));
    parser_ast_get_symbols
              (in_RSI,in_RDX,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0));
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa:
    std::
    set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
    emplace<char*&>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    parser_ast_get_symbols
              (in_RSI,in_RDX,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0));
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xe:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10:
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12:
    parser_ast_get_symbols
              (in_RSI,in_RDX,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0));
    break;
  default:
    msg = (string *)&stack0xffffffffffffff88;
    std::__cxx11::to_string(in_stack_ffffffffffffffbc);
    std::operator+(in_stack_ffffffffffffff78,__rhs);
    Abort(msg);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  }
  return;
}

Assistant:

void parser_ast_get_symbols (struct parser_node* node, std::set<std::string>& symbols,
                             std::set<std::string>& local_symbols)
{
    switch (node->type)
    {
    case PARSER_NUMBER:
        break;
    case PARSER_SYMBOL:
        symbols.emplace(((struct parser_symbol*)node)->name);
        break;
    case PARSER_ADD:
    case PARSER_SUB:
    case PARSER_MUL:
    case PARSER_DIV:
    case PARSER_ADD_PP:
    case PARSER_SUB_PP:
    case PARSER_MUL_PP:
    case PARSER_DIV_PP:
    case PARSER_LIST:
        parser_ast_get_symbols(node->l, symbols, local_symbols);
        parser_ast_get_symbols(node->r, symbols, local_symbols);
        break;
    case PARSER_NEG:
    case PARSER_NEG_P:
        parser_ast_get_symbols(node->l, symbols, local_symbols);
        break;
    case PARSER_F1:
        parser_ast_get_symbols(((struct parser_f1*)node)->l, symbols, local_symbols);
        break;
    case PARSER_F2:
        parser_ast_get_symbols(((struct parser_f2*)node)->l, symbols, local_symbols);
        parser_ast_get_symbols(((struct parser_f2*)node)->r, symbols, local_symbols);
        break;
    case PARSER_F3:
        parser_ast_get_symbols(((struct parser_f3*)node)->n1, symbols, local_symbols);
        parser_ast_get_symbols(((struct parser_f3*)node)->n2, symbols, local_symbols);
        parser_ast_get_symbols(((struct parser_f3*)node)->n3, symbols, local_symbols);
        break;
    case PARSER_ASSIGN:
        local_symbols.emplace(((struct parser_assign*)node)->s->name);
        parser_ast_get_symbols(((struct parser_assign*)node)->v, symbols, local_symbols);
        break;
    case PARSER_ADD_VP:
    case PARSER_SUB_VP:
    case PARSER_MUL_VP:
    case PARSER_DIV_VP:
        parser_ast_get_symbols(node->r, symbols, local_symbols);
        break;
    default:
        amrex::Abort("parser_ast_get_symbols: unknown node type " + std::to_string(node->type));
    }
}